

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpeg2StreamReader.h
# Opt level: O1

void __thiscall MPEG2StreamReader::MPEG2StreamReader(MPEG2StreamReader *this)

{
  MPEGStreamReader::MPEGStreamReader(&this->super_MPEGStreamReader);
  (this->super_MPEGStreamReader).super_AbstractStreamReader.super_BaseAbstractStreamReader.
  _vptr_BaseAbstractStreamReader = (_func_int **)&PTR__MPEG2StreamReader_00241b00;
  MPEGSequenceHeader::MPEGSequenceHeader(&this->m_sequence,0);
  MPEGGOPHeader::MPEGGOPHeader(&this->m_gop);
  MPEGPictureHeader::MPEGPictureHeader(&this->m_frame,0);
  this->m_isFirstFrame = true;
  this->spsFound = false;
  this->m_seqExtFound = false;
  this->m_lastIFrame = false;
  *(undefined8 *)&(this->super_MPEGStreamReader).field_0xdc = 0xffffffff;
  (this->super_MPEGStreamReader).field_0xda = 0;
  (this->super_MPEGStreamReader).m_longCodesAllowed = false;
  this->m_prevFrameDelay = 0;
  return;
}

Assistant:

MPEG2StreamReader() : m_sequence(0), m_frame(0)
    {
        m_isFirstFrame = true;
        spsFound = false;
        m_framesAtGop = 0;
        // m_lastFullFrame = true;
        m_lastRef = -1;
        m_seqExtFound = false;
        m_streamMsgPrinted = false;
        m_lastIFrame = false;
        m_longCodesAllowed = false;
        m_prevFrameDelay = 0;
    }